

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O1

void helper_sve_zip_p_aarch64(void *vd,void *vn,void *vm,uint32_t pred_desc)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  sbyte sVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint32_t *m;
  uint32_t *n;
  ARMPredicateReg tmp_m;
  ARMPredicateReg tmp_n;
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  
  uVar3 = pred_desc & 0x1f;
  uVar10 = uVar3 + 2;
  uVar4 = (ulong)uVar10;
  uVar7 = pred_desc >> 10 & 3;
  uVar12 = pred_desc >> 0xc & 1;
  sVar5 = (sbyte)uVar7;
  if (uVar3 < 7) {
    uVar10 = uVar10 * 4;
    iVar13 = uVar12 * uVar10;
    if (0x40U - iVar13 < uVar10) {
      __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                    ,0x158,"uint64_t extract64(uint64_t, int, int)");
    }
    bVar6 = (byte)iVar13;
    uVar10 = (uint)(0xffffffffffffffff >> (-(char)uVar10 & 0x3fU));
    uVar8 = (ulong)((uint)(*vn >> (bVar6 & 0x3f)) & uVar10);
    uVar4 = 4;
    do {
      uVar8 = (uVar8 | uVar8 << ((byte)(1 << ((byte)uVar4 & 0x1f)) & 0x3f)) &
              even_bit_esz_masks[uVar4];
      bVar2 = uVar7 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
    uVar9 = (ulong)(uVar10 & (uint)(*vm >> (bVar6 & 0x3f)));
    uVar4 = 4;
    do {
      uVar9 = (uVar9 | uVar9 << ((byte)(1 << ((byte)uVar4 & 0x1f)) & 0x3f)) &
              even_bit_esz_masks[uVar4];
      bVar2 = uVar7 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
    *(ulong *)vd = (uVar9 << ((byte)(1 << sVar5) & 0x3f)) + uVar8;
  }
  else {
    if ((ulong)((long)vn - (long)vd) < uVar4) {
      memcpy(local_58,vn,uVar4);
      vn = local_58;
    }
    if ((ulong)((long)vm - (long)vd) < uVar4) {
      memcpy(local_78,vm,uVar4);
      vm = local_78;
    }
    uVar4 = 0;
    if (uVar12 != 0) {
      uVar4 = (ulong)(uVar10 >> 1);
    }
    if ((uVar4 & 3) == 0) {
      uVar8 = 0;
      do {
        lVar1 = uVar8 + (uVar4 >> 2);
        uVar11 = (ulong)*(uint *)((long)vn + lVar1 * 4);
        uVar14 = (ulong)*(uint *)((long)vm + lVar1 * 4);
        uVar9 = 4;
        do {
          uVar11 = (uVar11 | uVar11 << ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f)) &
                   even_bit_esz_masks[uVar9];
          bVar2 = uVar7 < uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar2);
        uVar9 = 4;
        do {
          uVar14 = (uVar14 | uVar14 << ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f)) &
                   even_bit_esz_masks[uVar9];
          bVar2 = uVar7 < uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar2);
        *(ulong *)((long)vd + uVar8 * 8) = (uVar14 << ((byte)(1 << sVar5) & 0x3f)) + uVar11;
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar3 + 9 >> 3);
    }
    else {
      uVar8 = 0;
      do {
        uVar11 = (ulong)*(byte *)((long)vn + uVar8 + uVar4);
        uVar14 = (ulong)*(byte *)((long)vm + uVar8 + uVar4);
        uVar9 = 4;
        do {
          uVar11 = (uVar11 | uVar11 << ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f)) &
                   even_bit_esz_masks[uVar9];
          bVar2 = uVar7 < uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar2);
        uVar9 = 4;
        do {
          uVar14 = (uVar14 | uVar14 << ((byte)(1 << ((byte)uVar9 & 0x1f)) & 0x3f)) &
                   even_bit_esz_masks[uVar9];
          bVar2 = uVar7 < uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar2);
        *(short *)((long)vd + uVar8 * 2) =
             (short)((int)uVar14 << ((byte)(1 << sVar5) & 0x1f)) + (short)uVar11;
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar10 >> 1);
    }
  }
  return;
}

Assistant:

void HELPER(sve_zip_p)(void *vd, void *vn, void *vm, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    int esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    intptr_t high = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd;
    intptr_t i;

    if (oprsz <= 8) {
        uint64_t nn = *(uint64_t *)vn;
        uint64_t mm = *(uint64_t *)vm;
        int half = 4 * oprsz;

        nn = extract64(nn, high * half, half);
        mm = extract64(mm, high * half, half);
        nn = expand_bits(nn, esz);
        mm = expand_bits(mm, esz);
        d[0] = nn + (mm << (1 << esz));
    } else {
        ARMPredicateReg tmp_n, tmp_m;

        /* We produce output faster than we consume input.
           Therefore we must be mindful of possible overlap.  */
        if (((char *)vn - (char *)vd) < (uintptr_t)oprsz) {
            vn = memcpy(&tmp_n, vn, oprsz);
        }
        if (((char *)vm - (char *)vd) < (uintptr_t)oprsz) {
            vm = memcpy(&tmp_m, vm, oprsz);
        }
        if (high) {
            high = oprsz >> 1;
        }

        if ((high & 3) == 0) {
            uint32_t *n = vn, *m = vm;
            high >>= 2;

            for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
                uint64_t nn = n[H4(high + i)];
                uint64_t mm = m[H4(high + i)];

                nn = expand_bits(nn, esz);
                mm = expand_bits(mm, esz);
                d[i] = nn + (mm << (1 << esz));
            }
        } else {
            uint8_t *n = vn, *m = vm;
            uint16_t *d16 = vd;

            for (i = 0; i < oprsz / 2; i++) {
                uint16_t nn = n[H1(high + i)];
                uint16_t mm = m[H1(high + i)];

                nn = expand_bits(nn, esz);
                mm = expand_bits(mm, esz);
                d16[H2(i)] = nn + (mm << (1 << esz));
            }
        }
    }
}